

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O3

void roaring_bitmap_or_inplace(roaring_bitmap_t *x1,roaring_bitmap_t *x2)

{
  uint16_t **ppuVar1;
  byte type;
  ushort key;
  int iVar2;
  uint16_t *puVar3;
  byte bVar4;
  _Bool _Var5;
  array_container_t *paVar6;
  array_container_t *paVar7;
  array_container_t *dst;
  uint64_t uVar8;
  array_container_t *src_1;
  container_t *c;
  ushort *puVar9;
  ushort uVar10;
  byte type2;
  uint uVar11;
  int i;
  ulong uVar12;
  long lVar13;
  int iVar14;
  uint start_index;
  uint uVar15;
  ulong uVar16;
  uint8_t result_type;
  uint8_t local_5a;
  byte local_59;
  uint local_58;
  byte local_51;
  array_container_t *local_50;
  roaring_array_t *local_48;
  ulong local_40;
  array_container_t *local_38;
  
  local_5a = '\0';
  local_58 = (x2->high_low_container).size;
  if (local_58 == 0) {
    return;
  }
  uVar11 = (x1->high_low_container).size;
  local_40 = (ulong)uVar11;
  if (uVar11 == 0) {
    ra_overwrite(&x2->high_low_container,&x1->high_low_container,
                 (_Bool)((x2->high_low_container).flags & 1));
    return;
  }
  uVar10 = *(x1->high_low_container).keys;
  puVar9 = (x2->high_low_container).keys;
  iVar14 = uVar11 - 1;
  uVar16 = 0;
  lVar13 = 0;
  uVar11 = local_58;
  type2 = local_59;
  local_48 = &x2->high_low_container;
LAB_00116bdd:
  do {
    start_index = (uint)uVar16;
    key = *puVar9;
    uVar12 = (ulong)(int)lVar13;
    while( true ) {
      i = (int)uVar12;
      if (uVar10 == key) break;
      if (key <= uVar10) {
        local_59 = (x2->high_low_container).typecodes[uVar16 & 0xffff];
        c = get_copy_of_container
                      ((x2->high_low_container).containers[uVar16 & 0xffff],&local_59,
                       (_Bool)((x2->high_low_container).flags & 1));
        if ((local_48->flags & 1) != 0) {
          if (((roaring_array_t *)&local_48->size)->size <= (int)start_index) goto LAB_00117115;
          local_48->containers[(int)start_index] = c;
          local_48->typecodes[(int)start_index] = local_59;
        }
        ra_insert_new_key_value_at(&x1->high_low_container,i,key,c,local_59);
        local_40 = (ulong)((int)local_40 + 1);
        uVar15 = start_index + 1;
        uVar16 = (ulong)uVar15;
        x2 = (roaring_bitmap_t *)local_48;
        uVar11 = local_58;
        start_index = local_58;
        type2 = local_59;
        if (uVar15 == local_58) goto LAB_001170e0;
        lVar13 = uVar12 + 1;
        puVar9 = (ushort *)((ulong)((uVar15 & 0xffff) * 2) + (long)local_48->keys);
        iVar14 = iVar14 + 1;
        goto LAB_00116bdd;
      }
      if (iVar14 == i) goto LAB_00117085;
      uVar12 = uVar12 + 1;
      uVar10 = (x1->high_low_container).keys[uVar12 & 0xffff];
    }
    type = (x1->high_low_container).typecodes[uVar12 & 0xffff];
    src_1 = (array_container_t *)(x1->high_low_container).containers[uVar12 & 0xffff];
    paVar6 = src_1;
    bVar4 = type;
    if (type == 4) {
      bVar4 = *(byte *)&src_1->array;
      if (bVar4 == 4) goto LAB_001170e9;
      paVar6 = *(array_container_t **)src_1;
    }
    if (bVar4 == 3) {
      if (((paVar6->cardinality != 1) || (*paVar6->array != 0)) || (paVar6->array[1] != 0xffff))
      goto LAB_00116c75;
      goto LAB_00116d01;
    }
    if ((bVar4 != 2) && (bVar4 != 1)) {
      local_59 = type2;
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/RoaringBitmap[P]croaring_cmake_demo_from_single_header/dependencies/croaring/roaring.c"
                    ,0x1110,"_Bool container_is_full(const container_t *, uint8_t)");
    }
    if (paVar6->cardinality == 0x10000) goto LAB_00116d01;
LAB_00116c75:
    type2 = (x2->high_low_container).typecodes[uVar16 & 0xffff];
    paVar6 = (array_container_t *)(x2->high_low_container).containers[uVar16 & 0xffff];
    local_51 = type2;
    if (type == 4) {
      paVar7 = (array_container_t *)container_or(src_1,'\x04',paVar6,type2,&local_5a);
      x2 = (roaring_bitmap_t *)local_48;
      uVar11 = local_58;
      goto LAB_00116cc4;
    }
    bVar4 = type2;
    if (type2 == 4) {
      ppuVar1 = &paVar6->array;
      if (*(byte *)ppuVar1 == 4) {
LAB_001170e9:
        local_59 = type2;
        __assert_fail("*type != SHARED_CONTAINER_TYPE",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/RoaringBitmap[P]croaring_cmake_demo_from_single_header/dependencies/croaring/roaring.c"
                      ,0x1062,
                      "const container_t *container_unwrap_shared(const container_t *, uint8_t *)");
      }
      paVar6 = *(array_container_t **)paVar6;
      bVar4 = *(byte *)ppuVar1;
    }
    local_38 = (array_container_t *)0x0;
    paVar7 = src_1;
    switch((uint)bVar4 + (uint)type * 4) {
    case 5:
      local_50 = src_1;
      bitset_container_or((bitset_container_t *)src_1,(bitset_container_t *)paVar6,
                          (bitset_container_t *)src_1);
      if (local_50->cardinality == 0x10000) {
        paVar7 = (array_container_t *)run_container_create_given_capacity(1);
        if (paVar7 != (array_container_t *)0x0) {
          puVar3 = paVar7->array;
          iVar2 = paVar7->cardinality;
          (puVar3 + (long)iVar2 * 2)[0] = 0;
          (puVar3 + (long)iVar2 * 2)[1] = 0xffff;
          paVar7->cardinality = iVar2 + 1;
        }
        local_5a = '\x03';
        x2 = (roaring_bitmap_t *)local_48;
        src_1 = local_50;
        uVar11 = local_58;
      }
      else {
        local_5a = '\x01';
        paVar7 = local_50;
        x2 = (roaring_bitmap_t *)local_48;
        src_1 = local_50;
        uVar11 = local_58;
      }
      break;
    case 6:
      uVar8 = bitset_set_list_withcard
                        ((uint64_t *)src_1->array,(long)src_1->cardinality,paVar6->array,
                         (long)paVar6->cardinality);
      src_1->cardinality = (int32_t)uVar8;
      paVar6 = src_1;
LAB_00116f7f:
      local_5a = '\x01';
      paVar7 = src_1;
      x2 = (roaring_bitmap_t *)local_48;
      src_1 = paVar6;
      uVar11 = local_58;
      break;
    case 7:
      if (((paVar6->cardinality == 1) && (*paVar6->array == 0)) && (paVar6->array[1] == 0xffff)) {
        local_50 = src_1;
        paVar7 = (array_container_t *)calloc(1,0x10);
        local_5a = '\x03';
        run_container_copy((run_container_t *)paVar6,(run_container_t *)paVar7);
        x2 = (roaring_bitmap_t *)local_48;
        src_1 = local_50;
        uVar11 = local_58;
      }
      else {
        run_bitset_container_union
                  ((run_container_t *)paVar6,(bitset_container_t *)src_1,(bitset_container_t *)src_1
                  );
        local_5a = '\x01';
        x2 = (roaring_bitmap_t *)local_48;
        uVar11 = local_58;
      }
      break;
    default:
      local_59 = type2;
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/RoaringBitmap[P]croaring_cmake_demo_from_single_header/dependencies/croaring/roaring.c"
                    ,0x1553,
                    "container_t *container_ior(container_t *, uint8_t, const container_t *, uint8_t, uint8_t *)"
                   );
    case 9:
      local_50 = src_1;
      paVar7 = (array_container_t *)bitset_container_create();
      local_5a = '\x01';
      array_bitset_container_union
                (local_50,(bitset_container_t *)paVar6,(bitset_container_t *)paVar7);
      x2 = (roaring_bitmap_t *)local_48;
      src_1 = local_50;
      uVar11 = local_58;
      break;
    case 10:
      _Var5 = array_array_container_inplace_union(src_1,paVar6,&local_38);
      local_5a = '\x02' - _Var5;
      if (local_38 != (array_container_t *)0x0) {
        paVar7 = local_38;
      }
      x2 = (roaring_bitmap_t *)local_48;
      uVar11 = local_58;
      if (_Var5) {
        paVar7 = local_38;
      }
      break;
    case 0xb:
      local_50 = src_1;
      dst = (array_container_t *)calloc(1,0x10);
      array_run_container_union(local_50,(run_container_t *)paVar6,(run_container_t *)dst);
      paVar7 = (array_container_t *)
               convert_run_to_efficient_container((run_container_t *)dst,&local_5a);
      x2 = (roaring_bitmap_t *)local_48;
      src_1 = local_50;
      uVar11 = local_58;
      if (paVar7 != dst) {
        run_container_free((run_container_t *)dst);
        x2 = (roaring_bitmap_t *)local_48;
        src_1 = local_50;
        uVar11 = local_58;
      }
      break;
    case 0xd:
      if (((src_1->cardinality != 1) || (*src_1->array != 0)) || (src_1->array[1] != 0xffff)) {
        local_50 = src_1;
        src_1 = (array_container_t *)bitset_container_create();
        run_bitset_container_union
                  ((run_container_t *)local_50,(bitset_container_t *)paVar6,
                   (bitset_container_t *)src_1);
        paVar6 = local_50;
        goto LAB_00116f7f;
      }
      local_5a = '\x03';
      break;
    case 0xe:
      local_50 = src_1;
      array_run_container_inplace_union(paVar6,(run_container_t *)src_1);
      goto LAB_00116ec6;
    case 0xf:
      local_50 = src_1;
      run_container_union_inplace((run_container_t *)src_1,(run_container_t *)paVar6);
LAB_00116ec6:
      paVar7 = (array_container_t *)
               convert_run_to_efficient_container((run_container_t *)local_50,&local_5a);
      x2 = (roaring_bitmap_t *)local_48;
      src_1 = local_50;
      uVar11 = local_58;
    }
LAB_00116cc4:
    if (paVar7 != src_1) {
      container_free(src_1,type);
      x2 = (roaring_bitmap_t *)local_48;
      uVar11 = local_58;
    }
    if ((x1->high_low_container).size <= i) {
      local_59 = local_51;
LAB_00117115:
      __assert_fail("i < ra->size",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/RoaringBitmap[P]croaring_cmake_demo_from_single_header/dependencies/croaring/roaring.c"
                    ,0x1a3a,
                    "void ra_set_container_at_index(const roaring_array_t *, int32_t, container_t *, uint8_t)"
                   );
    }
    (x1->high_low_container).containers[uVar12] = paVar7;
    (x1->high_low_container).typecodes[uVar12] = local_5a;
    type2 = local_51;
LAB_00116d01:
    start_index = start_index + 1;
    uVar16 = (ulong)start_index;
    if ((iVar14 == i) || (start_index == uVar11)) {
LAB_001170e0:
      local_59 = type2;
      type2 = local_59;
      if (i + 1 != (int)local_40) {
        return;
      }
LAB_00117085:
      local_59 = type2;
      ra_append_copy_range
                (&x1->high_low_container,&x2->high_low_container,start_index,uVar11,
                 (_Bool)((x2->high_low_container).flags & 1));
      return;
    }
    lVar13 = uVar12 + 1;
    uVar10 = (x1->high_low_container).keys[(uint)lVar13 & 0xffff];
    puVar9 = (ushort *)((ulong)((start_index & 0xffff) * 2) + (long)(x2->high_low_container).keys);
  } while( true );
}

Assistant:

void roaring_bitmap_or_inplace(roaring_bitmap_t *x1,
                               const roaring_bitmap_t *x2) {
    uint8_t result_type = 0;
    int length1 = x1->high_low_container.size;
    const int length2 = x2->high_low_container.size;

    if (0 == length2) return;

    if (0 == length1) {
        roaring_bitmap_overwrite(x1, x2);
        return;
    }
    int pos1 = 0, pos2 = 0;
    uint8_t type1, type2;
    uint16_t s1 = ra_get_key_at_index(&x1->high_low_container, pos1);
    uint16_t s2 = ra_get_key_at_index(&x2->high_low_container, pos2);
    while (true) {
        if (s1 == s2) {
            container_t *c1 = ra_get_container_at_index(
                                    &x1->high_low_container, pos1, &type1);
            if (!container_is_full(c1, type1)) {
                container_t *c2 = ra_get_container_at_index(
                                        &x2->high_low_container, pos2, &type2);
                container_t *c =
                    (type1 == SHARED_CONTAINER_TYPE)
                        ? container_or(c1, type1, c2, type2, &result_type)
                        : container_ior(c1, type1, c2, type2, &result_type);

                if (c != c1) {  // in this instance a new container was created,
                                // and we need to free the old one
                    container_free(c1, type1);
                }
                ra_set_container_at_index(&x1->high_low_container, pos1, c,
                                          result_type);
            }
            ++pos1;
            ++pos2;
            if (pos1 == length1) break;
            if (pos2 == length2) break;
            s1 = ra_get_key_at_index(&x1->high_low_container, pos1);
            s2 = ra_get_key_at_index(&x2->high_low_container, pos2);

        } else if (s1 < s2) {  // s1 < s2
            pos1++;
            if (pos1 == length1) break;
            s1 = ra_get_key_at_index(&x1->high_low_container, pos1);

        } else {  // s1 > s2
            container_t *c2 = ra_get_container_at_index(&x2->high_low_container,
                                                        pos2, &type2);
            c2 = get_copy_of_container(c2, &type2, is_cow(x2));
            if (is_cow(x2)) {
                ra_set_container_at_index(&x2->high_low_container, pos2, c2,
                                          type2);
            }

            // container_t *c2_clone = container_clone(c2, type2);
            ra_insert_new_key_value_at(&x1->high_low_container, pos1, s2, c2,
                                       type2);
            pos1++;
            length1++;
            pos2++;
            if (pos2 == length2) break;
            s2 = ra_get_key_at_index(&x2->high_low_container, pos2);
        }
    }
    if (pos1 == length1) {
        ra_append_copy_range(&x1->high_low_container, &x2->high_low_container,
                             pos2, length2, is_cow(x2));
    }
}